

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# solver.cpp
# Opt level: O1

uint32 __thiscall Clasp::Solver::undoUntilImpl(Solver *this,uint32 level,bool forceSave)

{
  uint32 *puVar1;
  uint32 uVar2;
  uint uVar3;
  uint uVar4;
  bool sp;
  long *plVar5;
  uint uVar6;
  bool bVar7;
  
  uVar6 = *(uint *)&(this->levels_).field_0x14 & 0x3fffffff;
  if (uVar6 <= level) {
    uVar6 = level;
  }
  uVar3 = (this->levels_).super_type.ebo_.size;
  uVar4 = uVar3 - uVar6;
  if (uVar6 <= uVar3 && uVar4 != 0) {
    (this->levels_).jump = uVar4;
    sp = true;
    if (!forceSave) {
      if (*(uint *)&this->strategy_ < 0x10000) {
        sp = false;
      }
      else {
        sp = *(uint *)&this->strategy_ >> 0x10 <= uVar4;
      }
    }
    if ((this->conflict_).ebo_.size == 0) {
      bVar7 = -1 < *(int *)((this->levels_).super_type.ebo_.buf +
                           ((this->levels_).super_type.ebo_.size - 1));
    }
    else {
      bVar7 = false;
    }
    (this->conflict_).ebo_.size = 0;
    plVar5 = (long *)((this->heuristic_).ptr_ & 0xfffffffffffffffe);
    (**(code **)(*plVar5 + 0x40))
              (plVar5,this,*(uint *)((this->levels_).super_type.ebo_.buf + uVar6) & 0x3fffffff);
    undoLevel(this,(bool)(bVar7 & sp));
    puVar1 = &(this->levels_).jump;
    *puVar1 = *puVar1 - 1;
    uVar2 = *puVar1;
    while (uVar3 = uVar6, uVar2 != 0) {
      undoLevel(this,sp);
      puVar1 = &(this->levels_).jump;
      *puVar1 = *puVar1 - 1;
      uVar2 = *puVar1;
    }
  }
  return uVar3;
}

Assistant:

uint32 Solver::undoUntilImpl(uint32 level, bool forceSave) {
	level      = std::max( level, backtrackLevel() );
	if (level >= decisionLevel()) { return decisionLevel(); }
	uint32& n  = (levels_.jump = decisionLevel() - level);
	bool sp    = forceSave || (strategy_.saveProgress > 0 && ((uint32)strategy_.saveProgress) <= n);
	bool ok    = conflict_.empty() && levels_.back().freeze == 0;
	conflict_.clear();
	heuristic_->undoUntil( *this, levels_[level].trailPos);
	undoLevel(sp && ok);
	while (--n) { undoLevel(sp); }
	return level;
}